

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O0

void vfio_enable_dma(int device_fd)

{
  int iVar1;
  int *piVar2;
  ssize_t sVar3;
  int in_EDI;
  uint16_t dma;
  char buf [512];
  int err;
  int64_t result;
  vfio_region_info conf_reg;
  int bus_master_enable_bit;
  int command_register_offset;
  ushort local_252;
  long local_250;
  undefined1 local_248 [524];
  int local_3c;
  long local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  long local_18;
  undefined4 local_c;
  int local_8;
  int local_4;
  
  local_8 = 4;
  local_c = 2;
  local_30 = 0x20;
  local_20 = 0;
  local_18 = 0;
  local_28 = 7;
  local_4 = in_EDI;
  iVar1 = ioctl(in_EDI,0x3b6c,&local_30);
  local_250 = (long)iVar1;
  local_38 = local_250;
  if (local_250 == -1) {
    piVar2 = __errno_location();
    local_3c = *piVar2;
    __xpg_strerror_r(local_3c,local_248,0x200);
    fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",
            0x23,"vfio_enable_dma","get vfio config region info",local_248);
    exit(local_3c);
  }
  local_252 = 0;
  sVar3 = pread(local_4,&local_252,2,local_18 + local_8);
  if (sVar3 == 2) {
    local_252 = local_252 | (ushort)(1 << ((byte)local_c & 0x1f));
    sVar3 = pwrite(local_4,&local_252,2,local_18 + local_8);
    if (sVar3 == 2) {
      return;
    }
    __assert_fail("pwrite(device_fd, &dma, 2, conf_reg.offset + command_register_offset) == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c"
                  ,0x27,"void vfio_enable_dma(int)");
  }
  __assert_fail("pread(device_fd, &dma, 2, conf_reg.offset + command_register_offset) == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c"
                ,0x25,"void vfio_enable_dma(int)");
}

Assistant:

void vfio_enable_dma(int device_fd) {
	// write to the command register (offset 4) in the PCIe config space
	int command_register_offset = 4;
	// bit 2 is "bus master enable", see PCIe 3.0 specification section 7.5.1.1
	int bus_master_enable_bit = 2;
	// Get region info for config region
	struct vfio_region_info conf_reg = {.argsz = sizeof(conf_reg)};
	conf_reg.index = VFIO_PCI_CONFIG_REGION_INDEX;
	check_err(ioctl(device_fd, VFIO_DEVICE_GET_REGION_INFO, &conf_reg), "get vfio config region info");
	uint16_t dma = 0;
	assert(pread(device_fd, &dma, 2, conf_reg.offset + command_register_offset) == 2);
	dma |= 1 << bus_master_enable_bit;
	assert(pwrite(device_fd, &dma, 2, conf_reg.offset + command_register_offset) == 2);
}